

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O1

void calculateLH(int n_vert,vec3f *position,vec3f *normal,float *LHbuffer,char *light_obj_file)

{
  vec3f *pvVar1;
  int i;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  undefined **ppuVar5;
  vec3f *pvVar6;
  int _;
  int iVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  SampleInfo info;
  TriangleMesh light;
  float y [225];
  double acc [225];
  MT19937Sampler sampler;
  float local_1f34;
  float local_1f30;
  float local_1f2c;
  float local_1f28;
  float local_1f24;
  float local_1f20;
  float local_1f1c;
  vec3f local_1f18;
  undefined1 local_1f08 [16];
  undefined1 local_1ef8 [16];
  ulong local_1ee8;
  vec3f *local_1ee0;
  vec3f *local_1ed8;
  ulong local_1ed0;
  TriangleMesh local_1ec8;
  undefined1 local_1e88 [16];
  string local_1e78;
  float local_1e58 [228];
  double local_1ac8 [225];
  undefined **local_13c0 [625];
  undefined8 local_38;
  
  local_1ee0 = position;
  local_1ed8 = normal;
  github111116::ConsoleLogger::log<char[18]>(&console,(char (*) [18])"calculating LH...");
  std::__cxx11::string::string((string *)&local_1e78,light_obj_file,(allocator *)local_13c0);
  TriangleMesh::TriangleMesh(&local_1ec8,&local_1e78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e78._M_dataplus._M_p != &local_1e78.field_2) {
    operator_delete(local_1e78._M_dataplus._M_p);
  }
  if (0 < n_vert) {
    local_1ee8 = (ulong)(uint)n_vert;
    uVar8 = 0;
    do {
      iVar7 = (int)uVar8;
      if (((uint)(iVar7 * -0x3d70a3d7) >> 2 | iVar7 * 0x40000000) < 0x28f5c29) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\r    LH progress: ",0x12);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"          ",10);
      }
      local_13c0[0] = &PTR_get1f_001b6c10;
      local_13c0[1] = (undefined **)0x0;
      lVar4 = 2;
      ppuVar5 = (undefined **)0x0;
      do {
        ppuVar5 = (undefined **)
                  (ulong)((((uint)((ulong)ppuVar5 >> 0x1e) ^ (uint)ppuVar5) * 0x6c078965 +
                          (int)lVar4) - 1);
        local_13c0[lVar4] = ppuVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x271);
      local_38 = 0x270;
      iVar7 = 0;
      memset(local_1ac8,0,0x708);
      pvVar1 = local_1ee0 + uVar8;
      pvVar6 = local_1ed8 + uVar8;
      local_1ed0 = uVar8;
      do {
        uVar2 = (*(code *)local_13c0[0][2])
                          (local_13c0,
                           (ulong)((long)local_1ec8.super_BasicContainer.list.
                                         super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1ec8.super_BasicContainer.list.
                                        super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
        (*(local_1ec8.super_BasicContainer.list.
           super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2]->super_Primitive)._vptr_Primitive[2])
                  (&local_1f34,
                   local_1ec8.super_BasicContainer.list.
                   super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2],local_13c0);
        local_1f1c = local_1f1c /
                     (float)(ulong)((long)local_1ec8.super_BasicContainer.list.
                                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1ec8.super_BasicContainer.list.
                                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
        fVar10 = local_1f34 - pvVar1->x;
        fVar13 = local_1f30 - pvVar1->y;
        fVar12 = local_1f2c - pvVar1->z;
        fVar9 = fVar12 * fVar12 + fVar10 * fVar10 + fVar13 * fVar13;
        if (fVar9 < 0.0) {
          local_1ef8 = ZEXT416((uint)fVar10);
          local_1f08 = ZEXT416((uint)fVar13);
          fVar9 = sqrtf(fVar9);
          fVar10 = (float)local_1ef8._0_4_;
          fVar13 = (float)local_1f08._0_4_;
        }
        else {
          fVar9 = SQRT(fVar9);
        }
        fVar9 = 1.0 / fVar9;
        fVar10 = fVar10 * fVar9;
        fVar13 = fVar13 * fVar9;
        local_1f18.z = fVar12 * fVar9;
        local_1f18.y = fVar13;
        local_1f18.x = fVar10;
        fVar9 = local_1f34 - pvVar1->x;
        fVar12 = local_1f30 - pvVar1->y;
        fVar11 = local_1f2c - pvVar1->z;
        local_1e88 = ZEXT416((uint)(((local_1f20 * local_1f18.z +
                                     local_1f28 * fVar10 + local_1f24 * fVar13) /
                                    (fVar11 * fVar11 + fVar9 * fVar9 + fVar12 * fVar12)) /
                                   local_1f1c));
        local_1f08._0_4_ = fVar13 * pvVar6->y;
        local_1ef8._0_4_ = fVar10 * pvVar6->x;
        fVar10 = local_1f18.z * pvVar6->z;
        SHEvaluate(&local_1f18,0xe,local_1e58);
        fVar10 = fVar10 + (float)local_1ef8._0_4_ + (float)local_1f08._0_4_;
        if (fVar10 <= 0.0) {
          fVar10 = 0.0;
        }
        lVar4 = 0;
        do {
          local_1ac8[lVar4] =
               (double)(local_1e58[lVar4] * fVar10 * ABS((float)local_1e88._0_4_)) +
               local_1ac8[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xe1);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 100);
      lVar4 = 0;
      do {
        LHbuffer[lVar4] = (float)(local_1ac8[lVar4] / 100.0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xe1);
      uVar8 = local_1ed0 + 1;
      LHbuffer = LHbuffer + 0xe1;
    } while (uVar8 != local_1ee8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\r    LH progress: ",0x12);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,n_vert);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"           \n",0xc);
  local_1ec8.super_BasicContainer.super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001b6be8;
  if (local_1ec8.super_BasicContainer.list.
      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ec8.super_BasicContainer.list.
                    super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void calculateLH(int n_vert, const vec3f* position, const vec3f* normal, float* LHbuffer, const char light_obj_file[])
{
	console.log("calculating LH...");
	TriangleMesh light(light_obj_file);
	for (int vert=0; vert<n_vert; ++vert)
	{
		if (vert%100==0)
			std::cerr << "\r    LH progress: " << vert << "/" << n_vert << "          ";
		// sphfunc LH = [&](vec3f w)
		// {
		// 	Primitive::Hit h;
		// 	if (!light.intersect(Ray(position[i],w), &h)) return 0.0f;
		// 	if (w.y < 0) return 0.0f;
		// 	return std::max(0.0f, dot(normal[i],w));
		// };

	    MT19937Sampler sampler;

	    double acc[N_COEFFS];
    	float y[N_COEFFS];
	    memset(acc, 0, sizeof acc);
	    const int n_sample = 100;
    	for (int _=0; _<n_sample; ++_) {
			auto info = light.sampleSurface(sampler);
			vec3f w = normalized(info.p - position[vert]);
			float irr = dot(info.normal, w) / sqrlen(info.p - position[vert]) / info.pdf;
			irr = fabs(irr);
			irr *= std::max(0.0f, dot(normal[vert],w));
        	SHEvaluate(w, shorder-1, y);
	        for (int i=0; i<N_COEFFS; ++i)
	            acc[i] += irr * y[i];
    	}
    	for (int j=0; j<N_COEFFS; ++j)
    		LHbuffer[vert*N_COEFFS+j] = acc[j] / n_sample;
	}
	std::cerr << "\r    LH progress: " << n_vert << "/" << n_vert << "           \n";
}